

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

fixed_precise_measurement *
units::root(fixed_precise_measurement *__return_storage_ptr__,fixed_precise_measurement *fpm,
           int power)

{
  double dVar1;
  precise_unit pVar2;
  precise_unit local_40;
  precise_unit local_30;
  int local_1c;
  fixed_precise_measurement *pfStack_18;
  int power_local;
  fixed_precise_measurement *fpm_local;
  
  local_1c = power;
  pfStack_18 = fpm;
  fpm_local = __return_storage_ptr__;
  dVar1 = fixed_precise_measurement::value(fpm);
  dVar1 = numericalRoot<double>(dVar1,local_1c);
  local_40 = fixed_precise_measurement::units(pfStack_18);
  pVar2 = root(&local_40,local_1c);
  local_30._8_8_ = pVar2._8_8_;
  local_30.multiplier_ = pVar2.multiplier_;
  fixed_precise_measurement::fixed_precise_measurement(__return_storage_ptr__,dVar1,&local_30);
  return __return_storage_ptr__;
}

Assistant:

fixed_precise_measurement root(const fixed_precise_measurement& fpm, int power)
{
    return {numericalRoot(fpm.value(), power), root(fpm.units(), power)};
}